

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.c
# Opt level: O1

void linker_init(GlobalVars *gv)

{
  Symbol **ppSVar1;
  FFFuncs *pFVar2;
  
  initlist(&gv->linkfiles);
  initlist(&gv->selobjects);
  initlist(&gv->libobjects);
  initlist(&gv->sharedobjects);
  ppSVar1 = (Symbol **)alloc_hashtable(0x10000);
  gv->symbols = ppSVar1;
  initlist(&gv->pripointers);
  initlist(&gv->scriptsymbols);
  gv->got_base_name = "__GLOBAL_OFFSET_TABLE_";
  gv->plt_base_name = "__PROCEDURE_LINKAGE_TABLE_";
  pFVar2 = fff[gv->dest_format];
  if (gv->reloctab_format != 0) {
    if ((pFVar2->rtab_mask & gv->reloctab_format) != 0) {
      return;
    }
    error(0x7a,pFVar2->tname);
    pFVar2 = fff[gv->dest_format];
  }
  gv->reloctab_format = pFVar2->rtab_format;
  return;
}

Assistant:

void linker_init(struct GlobalVars *gv)
{
  initlist(&gv->linkfiles);
  initlist(&gv->selobjects);
  initlist(&gv->libobjects);
  initlist(&gv->sharedobjects);
  gv->symbols = alloc_hashtable(SYMHTABSIZE);
  initlist(&gv->pripointers);
  initlist(&gv->scriptsymbols);
  gv->got_base_name = gotbase_name;
  gv->plt_base_name = pltbase_name;

  if (gv->reloctab_format != RTAB_UNDEF) {
    if (!(fff[gv->dest_format]->rtab_mask & gv->reloctab_format)) {
      error(122,fff[gv->dest_format]->tname);
      gv->reloctab_format = fff[gv->dest_format]->rtab_format;
    }
  }
  else
    gv->reloctab_format = fff[gv->dest_format]->rtab_format;
}